

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SyntaxDumper.h
# Opt level: O0

Action __thiscall
psy::C::SyntaxDumper::visitForStatement(SyntaxDumper *this,ForStatementSyntax *node)

{
  StatementSyntax *pSVar1;
  ExpressionSyntax *pEVar2;
  ForStatementSyntax local_140 [56];
  ForStatementSyntax local_108 [56];
  ForStatementSyntax local_d0 [56];
  ForStatementSyntax local_98 [72];
  ForStatementSyntax local_50 [56];
  ForStatementSyntax *local_18;
  ForStatementSyntax *node_local;
  SyntaxDumper *this_local;
  
  local_18 = node;
  node_local = (ForStatementSyntax *)this;
  ForStatementSyntax::forKeyword(local_50);
  (**(code **)(*(long *)this + 0x2e8))(this,local_50,local_18);
  psy::C::SyntaxToken::~SyntaxToken((SyntaxToken *)local_50);
  ForStatementSyntax::openParenthesisToken(local_98);
  (**(code **)(*(long *)this + 0x2e8))(this,local_98,local_18);
  psy::C::SyntaxToken::~SyntaxToken((SyntaxToken *)local_98);
  ForStatementSyntax::extensionKeyword(local_d0);
  (**(code **)(*(long *)this + 0x2e8))(this,local_d0,local_18);
  psy::C::SyntaxToken::~SyntaxToken((SyntaxToken *)local_d0);
  pSVar1 = ForStatementSyntax::initializer(local_18);
  (**(code **)(*(long *)this + 0x2f0))(this,pSVar1);
  pEVar2 = ForStatementSyntax::condition(local_18);
  (**(code **)(*(long *)this + 0x2f0))(this,pEVar2);
  ForStatementSyntax::semicolonToken(local_108);
  (**(code **)(*(long *)this + 0x2e8))(this,local_108,local_18);
  psy::C::SyntaxToken::~SyntaxToken((SyntaxToken *)local_108);
  pEVar2 = ForStatementSyntax::expression(local_18);
  (**(code **)(*(long *)this + 0x2f0))(this,pEVar2);
  ForStatementSyntax::closeParenthesisToken(local_140);
  (**(code **)(*(long *)this + 0x2e8))(this,local_140,local_18);
  psy::C::SyntaxToken::~SyntaxToken((SyntaxToken *)local_140);
  pSVar1 = ForStatementSyntax::statement(local_18);
  (**(code **)(*(long *)this + 0x2f0))(this,pSVar1);
  return Skip;
}

Assistant:

virtual Action visitForStatement(const ForStatementSyntax* node) override
    {
        terminal(node->forKeyword(), node);
        terminal(node->openParenthesisToken(), node);
        terminal(node->extensionKeyword(), node);
        nonterminal(node->initializer());
        nonterminal(node->condition());
        terminal(node->semicolonToken(), node);
        nonterminal(node->expression());
        terminal(node->closeParenthesisToken(), node);
        nonterminal(node->statement());
        return Action::Skip;
    }